

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

Var Js::JavascriptString::DoStringSplit
              (Arguments *args,CallInfo *callInfo,JavascriptString *input,
              ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  CallFlags CVar4;
  JavascriptLibrary *pJVar5;
  JavascriptArray *this;
  Var pvVar6;
  ScriptConfiguration *this_00;
  JavascriptRegExp *thisObj;
  JavascriptString *match;
  undefined4 *puVar7;
  RecyclableObject *this_01;
  JavascriptArray *ary_2;
  JavascriptArray *ary_1;
  JavascriptString *separator;
  uint32 limit;
  JavascriptArray *ary;
  ScriptContext *scriptContext_local;
  JavascriptString *input_local;
  CallInfo *callInfo_local;
  Arguments *args_local;
  TypeId local_18;
  TypeId typeId;
  
  if ((SUB84(args->Info,0) & 0xffffff) == 1) {
    pJVar5 = ScriptContext::GetLibrary(scriptContext);
    this = JavascriptLibrary::CreateArray(pJVar5,1);
    Js::JavascriptArray::DirectSetItemAt<Js::JavascriptString*>(this,0,input);
    return this;
  }
  if (2 < (SUB84(args->Info,0) & 0xffffff)) {
    pvVar6 = Arguments::operator[](args,2);
    BVar3 = Js::JavascriptOperators::IsUndefinedObject(pvVar6);
    if (BVar3 == 0) {
      pvVar6 = Arguments::operator[](args,2);
      separator._4_4_ = JavascriptConversion::ToUInt32(pvVar6,scriptContext);
      goto LAB_01327e66;
    }
  }
  separator._4_4_ = 0xffffffff;
LAB_01327e66:
  this_00 = ScriptContext::GetConfig(scriptContext);
  bVar2 = ScriptConfiguration::IsES6RegExSymbolsEnabled(this_00);
  if (!bVar2) {
    pvVar6 = Arguments::operator[](args,1);
    bVar2 = VarIs<Js::JavascriptRegExp>(pvVar6);
    if (bVar2) {
      pvVar6 = Arguments::operator[](args,1);
      thisObj = UnsafeVarTo<Js::JavascriptRegExp>(pvVar6);
      bVar2 = RegexHelper::IsResultNotUsed
                        (SUB84(*callInfo,3) &
                         (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                          CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                         CallFlags_New));
      pvVar6 = RegexHelper::RegexSplit
                         (scriptContext,(RecyclableObject *)thisObj,input,separator._4_4_,bVar2,
                          (void *)0x0);
      return pvVar6;
    }
  }
  pvVar6 = Arguments::operator[](args,1);
  match = JavascriptConversion::ToString(pvVar6,scriptContext);
  CVar4 = Js::operator&(SUB84(*callInfo,3) &
                        (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                         CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                        CallFlags_New),CallFlags_NotUsed);
  if (CVar4 == CallFlags_None) {
    if (separator._4_4_ == 0) {
      pJVar5 = ScriptContext::GetLibrary(scriptContext);
      args_local = (Arguments *)JavascriptLibrary::CreateArray(pJVar5,0);
    }
    else {
      pvVar6 = Arguments::operator[](args,1);
      if (pvVar6 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      bVar2 = TaggedInt::Is(pvVar6);
      if (bVar2) {
        local_18 = TypeIds_FirstNumberType;
      }
      else {
        bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar6);
        if (bVar2) {
          local_18 = TypeIds_Number;
        }
        else {
          this_01 = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
          if (this_01 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          local_18 = RecyclableObject::GetTypeId(this_01);
          if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(this_01), BVar3 == 0))
          {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
        }
      }
      if (local_18 == TypeIds_Undefined) {
        pJVar5 = ScriptContext::GetLibrary(scriptContext);
        args_local = (Arguments *)JavascriptLibrary::CreateArray(pJVar5,1);
        Js::JavascriptArray::DirectSetItemAt<Js::JavascriptString*>
                  ((JavascriptArray *)args_local,0,input);
      }
      else {
        args_local = (Arguments *)RegexHelper::StringSplit(match,input,separator._4_4_);
      }
    }
  }
  else {
    pJVar5 = ScriptContext::GetLibrary(scriptContext);
    args_local = (Arguments *)JavascriptLibraryBase::GetNull(&pJVar5->super_JavascriptLibraryBase);
  }
  return args_local;
}

Assistant:

Var JavascriptString::DoStringSplit(Arguments& args, CallInfo& callInfo, JavascriptString* input, ScriptContext* scriptContext)
    {
        if (args.Info.Count == 1)
        {
            JavascriptArray* ary = scriptContext->GetLibrary()->CreateArray(1);
            ary->DirectSetItemAt(0, input);
            return ary;
        }
        else
        {
            uint32 limit;
            if (args.Info.Count < 3 || JavascriptOperators::IsUndefinedObject(args[2]))
            {
                limit = UINT_MAX;
            }
            else
            {
                limit = JavascriptConversion::ToUInt32(args[2], scriptContext);
            }

            // When the config is enabled, the operation is handled by RegExp.prototype[@@split].
            if (!scriptContext->GetConfig()->IsES6RegExSymbolsEnabled()
                && VarIs<JavascriptRegExp>(args[1]))
            {
                return RegexHelper::RegexSplit(scriptContext, UnsafeVarTo<JavascriptRegExp>(args[1]), input, limit,
                    RegexHelper::IsResultNotUsed(callInfo.Flags));
            }
            else
            {
                JavascriptString* separator = JavascriptConversion::ToString(args[1], scriptContext);

                if (callInfo.Flags & CallFlags_NotUsed)
                {
                    return scriptContext->GetLibrary()->GetNull();
                }

                if (!limit)
                {
                    JavascriptArray* ary = scriptContext->GetLibrary()->CreateArray(0);
                    return ary;
                }

                if (JavascriptOperators::GetTypeId(args[1]) == TypeIds_Undefined)
                {
                    JavascriptArray* ary = scriptContext->GetLibrary()->CreateArray(1);
                    ary->DirectSetItemAt(0, input);
                    return ary;
                }

                return RegexHelper::StringSplit(separator, input, limit);
            }
        }
    }